

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemeReference.cpp
# Opt level: O0

cell * references::scheme::proc_mul(cell *__return_storage_ptr__,cells *c)

{
  bool bVar1;
  char *__nptr;
  long lVar2;
  long n_00;
  string local_50;
  __normal_iterator<const_references::scheme::cell_*,_std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>_>
  local_30;
  __normal_iterator<const_references::scheme::cell_*,_std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>_>
  local_28;
  cellit i;
  long n;
  cells *c_local;
  
  i._M_current = (cell *)0x1;
  local_28._M_current =
       (cell *)std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>::
               begin(c);
  while( true ) {
    local_30._M_current =
         (cell *)std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>::
                 end(c);
    bVar1 = __gnu_cxx::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_references::scheme::cell_*,_std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>_>
    ::operator->(&local_28);
    __nptr = (char *)std::__cxx11::string::c_str();
    lVar2 = atol(__nptr);
    i._M_current = lVar2 * i._M_current;
    __gnu_cxx::
    __normal_iterator<const_references::scheme::cell_*,_std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>_>
    ::operator++(&local_28);
  }
  str_abi_cxx11_(&local_50,(scheme *)i._M_current,n_00);
  cell::cell(__return_storage_ptr__,Number,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

cell proc_mul(const cells & c)
{
	long n(1);
	for (cellit i = c.begin(); i != c.end(); ++i) n *= atol(i->val.c_str());
	return cell(Number, str(n));
}